

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * __thiscall
IDLExport::getIDLAbsolute_abi_cxx11_(string *__return_storage_ptr__,IDLExport *this,Type *type)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  anon_unknown.dwarf_1aacf::getIDLAbsolute(__return_storage_ptr__,type,this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLAbsolute(Type const& type) const
{
    return ::getIDLAbsolute(type, *this);
}